

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O3

_Bool bp_wp_matches(ARMCPU_conflict1 *cpu,int n,_Bool is_wp)

{
  CPUWatchpoint *pCVar1;
  CPUBreakpoint *pCVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar3 = (cpu->env).features;
  if ((uVar3 >> 0x21 & 1) == 0) {
    bVar9 = false;
  }
  else if ((cpu->env).aarch64 == 0) {
    bVar9 = true;
    if (((cpu->env).uncached_cpsr & 0x1f) != 0x16) goto LAB_0060beca;
  }
  else {
    bVar9 = true;
    if ((~(cpu->env).pstate & 0xc) != 0) {
LAB_0060beca:
      bVar9 = ((cpu->env).cp15.scr_el3 & 1) == 0;
    }
  }
  uVar5 = (uint)uVar3;
  if ((uVar5 >> 9 & 1) == 0) {
    if ((cpu->env).aarch64 == 0) {
      uVar8 = (cpu->env).uncached_cpsr & 0x1f;
      if (uVar8 == 0x10) {
        uVar8 = 0;
      }
      else if (uVar8 == 0x16) {
LAB_0060bf9d:
        uVar8 = 3;
      }
      else if (uVar8 == 0x1a) {
        uVar8 = 2;
      }
      else {
        if ((uVar3 & 0x200000000) != 0) {
          if (uVar8 == 0x16) {
            uVar8 = 3;
            if ((uVar5 >> 0x1c & 1) == 0) goto LAB_0060bfa3;
          }
          else if ((uVar3 & 0x10000000) == 0 && ((cpu->env).cp15.scr_el3 & 1) == 0)
          goto LAB_0060bf9d;
        }
        uVar8 = 1;
      }
    }
    else {
      uVar8 = (cpu->env).pstate >> 2 & 3;
    }
  }
  else {
    uVar8 = 1;
    if ((cpu->env).v7m.exception == 0) {
      uVar8 = ~(cpu->env).v7m.control[(cpu->env).v7m.secure] & 1;
    }
  }
LAB_0060bfa3:
  if (!is_wp) {
    if ((cpu->env).aarch64 == 0) {
      uVar3 = (ulong)(cpu->env).regs[0xf];
    }
    else {
      uVar3 = (cpu->env).pc;
    }
    pCVar2 = (cpu->env).cpu_breakpoint[n];
    if (pCVar2 == (CPUBreakpoint *)0x0) {
      return false;
    }
    if (pCVar2->pc != uVar3) {
      return false;
    }
    uVar3 = (cpu->env).cp15.dbgbcr[n];
    uVar7 = (uint)uVar3;
    switch((uint)(uVar3 >> 0xe) & 3) {
    case 0:
      goto switchD_0060bff7_caseD_0;
    default:
      goto switchD_0060bff7_caseD_1;
    case 2:
      goto switchD_0060bff7_caseD_2;
    }
  }
  pCVar1 = (cpu->env).cpu_watchpoint[n];
  if (pCVar1 == (CPUWatchpoint *)0x0) {
    return false;
  }
  if ((pCVar1->flags & 0xc0) == 0) {
    return false;
  }
  uVar7 = 0;
  if (((uint)pCVar1->hitattrs & 4) == 0) {
    uVar7 = uVar8;
  }
  uVar8 = uVar7;
  uVar3 = (cpu->env).cp15.dbgwcr[n];
  uVar7 = (uint)uVar3;
  switch((uint)(uVar3 >> 0xe) & 3) {
  case 0:
    break;
  default:
switchD_0060bff7_caseD_1:
    if (bVar9) {
      return false;
    }
    break;
  case 2:
switchD_0060bff7_caseD_2:
    if (!bVar9) {
      return false;
    }
  }
switchD_0060bff7_caseD_0:
  if (uVar8 - 2 < 2) {
    uVar8 = uVar7 >> 0xd & 1;
  }
  else if (uVar8 == 0) {
    uVar8 = uVar7 & 4;
  }
  else {
    uVar8 = uVar7 & 2;
  }
  if (uVar8 == 0) {
    return false;
  }
  if ((uVar7 >> 0x14 & 1) == 0) {
    return true;
  }
  uVar8 = uVar7 >> 0x10 & 0xf;
  if ((uVar5 >> 0x1c & 1) == 0) {
    uVar5 = (cpu->isar).dbgdidr;
    uVar7 = uVar5 >> 0x18;
    uVar5 = uVar5 >> 0x14 & 0xf;
  }
  else {
    uVar5 = (uint)(cpu->isar).id_aa64dfr0;
    uVar7 = uVar5 >> 0xc;
    uVar5 = uVar5 >> 0x1c;
  }
  if ((uVar7 & 0xf) < uVar8) {
    return false;
  }
  if ((int)uVar8 < (int)((uVar7 & 0xf) - uVar5)) {
    return false;
  }
  uVar3 = (cpu->env).cp15.dbgbcr[uVar8];
  if ((uVar3 & 1) == 0) {
    return false;
  }
  uVar5 = (uint)(uVar3 >> 0x14) & 0xf;
  uVar4 = arm_hcr_el2_eff_aarch64(&cpu->env);
  if (uVar5 == 0xd) {
    lVar6 = 0xa850;
    goto LAB_0060c1df;
  }
  lVar6 = 0xa848;
  if (uVar5 == 7) goto LAB_0060c1df;
  if (uVar5 != 3) {
    return false;
  }
  uVar3 = (cpu->env).features;
  if (((uint)uVar3 >> 9 & 1) == 0) {
    if ((cpu->env).aarch64 != 0) {
      uVar5 = (cpu->env).pstate >> 2 & 3;
      goto LAB_0060c17d;
    }
    uVar5 = (cpu->env).uncached_cpsr & 0x1f;
    if (uVar5 == 0x10) goto LAB_0060c1c2;
    if (uVar5 == 0x16) {
      return false;
    }
    if (uVar5 != 0x1a) {
      if ((uVar3 & 0x200000000) != 0) {
        if (uVar5 == 0x16) {
          if (((uint)uVar3 >> 0x1c & 1) == 0) {
            return false;
          }
        }
        else if ((uVar3 & 0x10000000) == 0 && ((cpu->env).cp15.scr_el3 & 1) == 0) {
          return false;
        }
      }
      goto LAB_0060c1df;
    }
  }
  else {
    if ((cpu->env).v7m.exception != 0) goto LAB_0060c1df;
    uVar5 = ~(cpu->env).v7m.control[(cpu->env).v7m.secure] & 1;
LAB_0060c17d:
    if (uVar5 == 0) {
LAB_0060c1c2:
      lVar6 = (ulong)((~uVar4 & 0x408000000) == 0) * 8 + 0xa848;
      goto LAB_0060c1df;
    }
    if (uVar5 == 1) goto LAB_0060c1df;
    if (uVar5 != 2) {
      return false;
    }
  }
  lVar6 = 0xa850;
  if ((uVar4 & 0x400000000) == 0) {
    return false;
  }
LAB_0060c1df:
  if (*(int *)((long)(cpu->parent_obj).jmp_env[0].__jmpbuf + lVar6 + -0x40) !=
      (int)(cpu->env).cp15.dbgbvr[uVar8]) {
    return false;
  }
  return true;
}

Assistant:

static bool bp_wp_matches(ARMCPU *cpu, int n, bool is_wp)
{
    CPUARMState *env = &cpu->env;
    uint64_t cr;
    int pac, hmc, ssc, wt, lbn;
    /*
     * Note that for watchpoints the check is against the CPU security
     * state, not the S/NS attribute on the offending data access.
     */
    bool is_secure = arm_is_secure(env);
    int access_el = arm_current_el(env);

    if (is_wp) {
        CPUWatchpoint *wp = env->cpu_watchpoint[n];

        if (!wp || !(wp->flags & BP_WATCHPOINT_HIT)) {
            return false;
        }
        cr = env->cp15.dbgwcr[n];
        if (wp->hitattrs.user) {
            /*
             * The LDRT/STRT/LDT/STT "unprivileged access" instructions should
             * match watchpoints as if they were accesses done at EL0, even if
             * the CPU is at EL1 or higher.
             */
            access_el = 0;
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];

        if (!env->cpu_breakpoint[n] || env->cpu_breakpoint[n]->pc != pc) {
            return false;
        }
        cr = env->cp15.dbgbcr[n];
    }
    /*
     * The WATCHPOINT_HIT flag guarantees us that the watchpoint is
     * enabled and that the address and access type match; for breakpoints
     * we know the address matched; check the remaining fields, including
     * linked breakpoints. We rely on WCR and BCR having the same layout
     * for the LBN, SSC, HMC, PAC/PMC and is-linked fields.
     * Note that some combinations of {PAC, HMC, SSC} are reserved and
     * must act either like some valid combination or as if the watchpoint
     * were disabled. We choose the former, and use this together with
     * the fact that EL3 must always be Secure and EL2 must always be
     * Non-Secure to simplify the code slightly compared to the full
     * table in the ARM ARM.
     */
    pac = extract64(cr, 1, 2);
    hmc = extract64(cr, 13, 1);
    ssc = extract64(cr, 14, 2);

    switch (ssc) {
    case 0:
        break;
    case 1:
    case 3:
        if (is_secure) {
            return false;
        }
        break;
    case 2:
        if (!is_secure) {
            return false;
        }
        break;
    }

    switch (access_el) {
    case 3:
    case 2:
        if (!hmc) {
            return false;
        }
        break;
    case 1:
        if (extract32(pac, 0, 1) == 0) {
            return false;
        }
        break;
    case 0:
        if (extract32(pac, 1, 1) == 0) {
            return false;
        }
        break;
    default:
        g_assert_not_reached();
    }

    wt = extract64(cr, 20, 1);
    lbn = extract64(cr, 16, 4);

    if (wt && !linked_bp_matches(cpu, lbn)) {
        return false;
    }

    return true;
}